

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessGenSpacingQueryCase::iterate
          (TessGenSpacingQueryCase *this)

{
  TestLog *pTVar1;
  Context *pCVar2;
  RenderContext *renderCtx;
  undefined8 uVar3;
  _Base_ptr p_Var4;
  int iVar5;
  undefined4 extraout_var;
  ContextInfo *__dest;
  Context *__dest_00;
  string *description;
  char *globalLayouts;
  char *globalLayouts_00;
  long lVar6;
  long lVar7;
  ScopedLogSection section;
  CallLogWrapper gl;
  ShaderProgram program;
  ResultCollector result;
  Context *local_3e8;
  TestContext *local_3e0;
  Context local_3d8;
  _Base_ptr local_3c0;
  undefined1 local_3b8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  _Base_ptr local_378;
  value_type local_370;
  uint local_350 [2];
  value_type local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  uint local_2a8;
  value_type local_2a0;
  long local_280;
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  CallLogWrapper local_238;
  undefined1 local_220 [152];
  GLuint local_188;
  bool local_160;
  undefined1 local_150 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_c0;
  undefined1 local_a0 [32];
  ResultCollector local_80;
  
  pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  local_220._0_8_ = local_220 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar1,(string *)local_220);
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  iVar5 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_238,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log);
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  local_238.m_enableLog = true;
  lVar7 = 0;
  do {
    pTVar1 = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    local_220._0_8_ = local_220 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Type","");
    description = (string *)local_150;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)description,iterate::s_modes[lVar7].description,
               (allocator<char> *)local_350);
    tcu::ScopedLogSection::ScopedLogSection
              ((ScopedLogSection *)(local_3b8 + 0x10),pTVar1,(string *)local_220,description);
    if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
      operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
    }
    local_280 = lVar7;
    if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    renderCtx = pCVar2->m_renderCtx;
    memset(local_150,0,0xac);
    local_a0._0_8_ = (pointer)0x0;
    local_a0[8] = 0;
    local_a0._9_7_ = 0;
    local_a0[0x10] = 0;
    local_a0._17_8_ = 0;
    local_3d8.m_contextInfo = (ContextInfo *)local_3b8;
    local_378 = (_Base_ptr)0x75;
    __dest = (ContextInfo *)
             std::__cxx11::string::_M_create((ulong *)&local_3d8.m_contextInfo,(ulong)&local_378);
    p_Var4 = local_378;
    local_3b8._0_8_ = local_378;
    local_3d8.m_contextInfo = __dest;
    memcpy(__dest,
           "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
           ,0x75);
    local_3c0 = p_Var4;
    *(undefined1 *)((long)&p_Var4->_M_color + (long)&__dest->_vptr_ContextInfo) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2c8,(_anonymous_namespace_ *)pCVar2->m_renderCtx,
               (Context *)local_3d8.m_contextInfo,(char *)description);
    local_350[0] = 0;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,local_2c8._M_dataplus._M_p,
               local_2c8._M_dataplus._M_p + local_2c8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + (ulong)local_350[0] * 0x18),&local_348);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    local_3e8 = &local_3d8;
    local_3b8._24_8_ = (TestContext *)0x7f;
    __dest_00 = (Context *)
                std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)(local_3b8 + 0x18));
    uVar3 = local_3b8._24_8_;
    local_3d8.m_testCtx = (TestContext *)local_3b8._24_8_;
    local_3e8 = __dest_00;
    memcpy(__dest_00,
           "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
           ,0x7f);
    local_3e0 = (TestContext *)uVar3;
    *(undefined1 *)((long)(Platform **)uVar3 + (long)&__dest_00->m_testCtx) = 0;
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e8,(_anonymous_namespace_ *)pCVar2->m_renderCtx,local_3e8,(char *)description
              );
    local_378 = (_Base_ptr)CONCAT44(local_378._4_4_,1);
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_2e8._M_dataplus._M_p,
               local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + ((ulong)local_378 & 0xffffffff) * 0x18),&local_370);
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
              ((string *)local_258,"layout(vertices=6) out",globalLayouts);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_308,(_anonymous_namespace_ *)pCVar2->m_renderCtx,(Context *)local_258._0_8_,
               (char *)description);
    local_3b8._24_4_ = 3;
    local_3b8._32_8_ = &local_388;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_3b8 + 0x20),local_308._M_dataplus._M_p,
               local_308._M_dataplus._M_p + local_308._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + (local_3b8._24_8_ & 0xffffffff) * 0x18),
                (value_type *)(local_3b8 + 0x20));
    pCVar2 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
    (anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
              ((string *)local_278,iterate::s_modes[lVar7].layout,globalLayouts_00);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_328,(_anonymous_namespace_ *)pCVar2->m_renderCtx,(Context *)local_278._0_8_,
               (char *)description);
    local_2a8 = 4;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,local_328._M_dataplus._M_p,
               local_328._M_dataplus._M_p + local_328._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + (ulong)local_2a8 * 0x18),&local_2a0);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)local_220,renderCtx,(ProgramSources *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_278._0_8_ != (Context *)(local_278 + 0x10)) {
      operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._32_8_ != &local_388) {
      operator_delete((void *)local_3b8._32_8_,local_388._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    if ((Context *)local_258._0_8_ != (Context *)(local_258 + 0x10)) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_3e8 != &local_3d8) {
      operator_delete(local_3e8,(ulong)((long)&(local_3d8.m_testCtx)->m_platform + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if (local_3d8.m_contextInfo != (ContextInfo *)local_3b8) {
      operator_delete(local_3d8.m_contextInfo,(ulong)((long)(_Rb_tree_color *)local_3b8._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_c0);
    lVar6 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_150 + lVar6));
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
    glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode
                    .m_testCtx)->m_log,(ShaderProgram *)local_220);
    if (local_160 == false) {
      local_150._0_8_ = local_150 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_150,"failed to build program","");
      tcu::ResultCollector::fail(&local_80,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
      }
    }
    else {
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_80,&local_238,local_188,0x8e77,iterate::s_modes[lVar7].spacing,
                 QUERY_PROGRAM_INTEGER);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_220);
    tcu::TestLog::endSection((TestLog *)local_3b8._16_8_);
    lVar7 = local_280 + 1;
  } while (lVar7 != 4);
  tcu::ResultCollector::setTestContextResult
            (&local_80,
             (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  glu::CallLogWrapper::~CallLogWrapper(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

TessGenSpacingQueryCase::IterateResult TessGenSpacingQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	static const struct
	{
		const char* description;
		const char* layout;
		glw::GLenum spacing;
	} s_modes[] =
	{
		{ "Default spacing",			"layout(triangles) in",								GL_EQUAL			},
		{ "Equal spacing",				"layout(triangles, equal_spacing) in",				GL_EQUAL			},
		{ "Fractional even spacing",	"layout(triangles, fractional_even_spacing) in",	GL_FRACTIONAL_EVEN	},
		{ "Fractional odd spacing",		"layout(triangles, fractional_odd_spacing) in",		GL_FRACTIONAL_ODD	},
	};

	checkTessellationSupport(m_context);
	gl.enableLogging(true);

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_modes); ++ndx)
	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Type", s_modes[ndx].description);

		glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=6) out").c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource(s_modes[ndx].layout).c_str())));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			result.fail("failed to build program");
		else
			verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, s_modes[ndx].spacing, QUERY_PROGRAM_INTEGER);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}